

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

double fas197(double *b,int pq,void *params)

{
  size_t __size;
  uint a;
  uint MQ;
  int N;
  int MR;
  double *P;
  double *Q;
  double *VW;
  double *VL;
  double *VK;
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  bool bVar4;
  double local_48;
  double ssq;
  double fact;
  
  ssq = 0.0;
  local_48 = 0.0;
  a = *params;
  MQ = *(uint *)((long)params + 8);
  fact = (double)(long)*(int *)((long)params + 0x18);
  MR = imax(a,MQ + 1);
  P = (double *)malloc((long)(int)a * 8);
  Q = (double *)malloc((long)(int)MQ << 3);
  __size = (long)MR * 8 + 8;
  VW = (double *)malloc(__size);
  VL = (double *)malloc(__size);
  VK = (double *)malloc((long)MR << 3);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < (int)a) {
    uVar2 = (ulong)a;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    P[uVar1] = b[uVar1];
  }
  uVar1 = 0;
  uVar2 = 0;
  if (0 < (int)MQ) {
    uVar2 = (ulong)MQ;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    Q[uVar1] = b[(long)(int)a + uVar1];
  }
  N = SUB84(fact,0);
  if (*(int *)((long)params + 0x1c) == 1) {
    pdVar3 = (double *)((long)params + 0x680);
    uVar2 = 0;
    if (0 < N) {
      uVar2 = (ulong)fact & 0xffffffff;
    }
    while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
      *pdVar3 = pdVar3[N * 2] - b[(int)(MQ + a)];
      pdVar3 = pdVar3 + 1;
    }
  }
  *(undefined8 *)((long)params + 0x30) = 0;
  flikam(P,a,Q,MQ,(double *)((long)params + 0x680),(double *)((long)params + (long)fact * 8 + 0x680)
         ,N,&local_48,&ssq,VW,VL,MR + 1,VK,MR,0.001);
  fact = local_48 * ssq;
  free(P);
  free(Q);
  free(VW);
  free(VL);
  free(VK);
  return fact;
}

Assistant:

double fas197(double *b, int pq, void *params) {
	double value, ssq, fact, delta;
	int ip, iq, i, ifault, N;
	double *phi, *theta,*VW,*VK,*VL;
	int MR, MRP1;

	value = ssq = fact = 0.0;
	alik_object obj = (alik_object)params;

	ip = obj->p;
	iq = obj->q;
	N = obj->N;
	MR = imax(ip, iq + 1);
	MRP1 = MR + 1;
	phi = (double*)malloc(sizeof(double)* ip);
	theta = (double*)malloc(sizeof(double)* iq);
	VW = (double*)malloc(sizeof(double*)*MRP1);
	VL = (double*)malloc(sizeof(double*)*MRP1);
	VK = (double*)malloc(sizeof(double*)*MR);

	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i + ip];
	}

	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip + iq];
		}
	}


	delta = 0.001;
	//mdisplay(P, 1, np);

	obj->ssq = ssq;
	//mdisplay(phi, 1, ip);
	ifault = flikam(phi, ip, theta, iq, obj->x, obj->x+N, N, &ssq, &fact, VW, VL, MRP1, VK, MR, delta);
	value = ssq*fact;

	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(VW);
	free(VL);
	free(VK);
	//free(bt);
	return value;
}